

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O2

Leaf * __thiscall
SuffixTree::GeneralizedSuffixTree::InsertLeaf
          (GeneralizedSuffixTree *this,uint letter,uint string,uint pos)

{
  size_type sVar1;
  Leaf *pLVar2;
  uint local_2c [2];
  uint letter_local;
  
  local_2c[0] = letter;
  if (this->active_length != 0) {
    __assert_fail("!active_length",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kachkov98[P]suffixtree/suffixtree.cpp"
                  ,0x119,"Leaf *SuffixTree::GeneralizedSuffixTree::InsertLeaf(uint, uint, uint)");
  }
  sVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_SuffixTree::Edge>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::count(&(this->active_node->edges)._M_h,local_2c);
  if (sVar1 == 0) {
    pLVar2 = AllocLeaf(this,this->active_node,string);
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,SuffixTree::Edge>,std::allocator<std::pair<unsigned_int_const,SuffixTree::Edge>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<unsigned_int&,SuffixTree::Edge>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,SuffixTree::Edge>,std::allocator<std::pair<unsigned_int_const,SuffixTree::Edge>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->active_node->edges,local_2c);
    return pLVar2;
  }
  __assert_fail("!active_node->edges.count (letter)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kachkov98[P]suffixtree/suffixtree.cpp"
                ,0x11a,"Leaf *SuffixTree::GeneralizedSuffixTree::InsertLeaf(uint, uint, uint)");
}

Assistant:

Leaf *GeneralizedSuffixTree::InsertLeaf (uint letter, uint string, uint pos)
{
    // can not insert leaf on the middle of edge
    assert (!active_length);
    assert (!active_node->edges.count (letter));
    Leaf *leaf = AllocLeaf (active_node, string);
    active_node->edges.emplace (letter, Edge (leaf, string, pos));
    return leaf;
}